

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

int yang_print_model_(lyout *out,int level,lys_module *module)

{
  int iVar1;
  int iVar2;
  lys_module *plVar3;
  char *pcVar4;
  lys_node *local_30;
  lys_node *node;
  int p;
  uint i;
  lys_module *module_local;
  int level_local;
  lyout *out_local;
  
  if ((module->field_0x40 & 1) == 0) {
    pcVar4 = "";
    if (((byte)module->field_0x40 >> 4 & 3) == 1) {
      pcVar4 = " // DEVIATED";
    }
    ly_print(out,"%*smodule %s {%s\n",(ulong)(uint)(level << 1),"",module->name,pcVar4);
    iVar1 = level + 1;
    if (((byte)module->field_0x40 >> 1 & 7) != 0) {
      pcVar4 = "1";
      if (((byte)module->field_0x40 >> 1 & 7) == 2) {
        pcVar4 = "1.1";
      }
      yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_VERSION,'\0',pcVar4,module,module->ext,
                         (uint)module->ext_size);
    }
    yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_NAMESPACE,'\0',module->ns,module,module->ext,
                       (uint)module->ext_size);
    yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                       (uint)module->ext_size);
  }
  else {
    pcVar4 = "";
    if (((byte)module->field_0x40 >> 4 & 3) == 1) {
      pcVar4 = " // DEVIATED";
    }
    ly_print(out,"%*ssubmodule %s {%s\n",(ulong)(uint)(level << 1),"",module->name,pcVar4);
    iVar1 = level + 1;
    plVar3 = lys_main_module(module);
    if ((1 < ((byte)plVar3->field_0x40 >> 1 & 7)) ||
       (iVar2 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_VERSION), iVar2 != -1))
    {
      pcVar4 = "1";
      if ((*(byte *)&module->data->parent >> 1 & 7) == 2) {
        pcVar4 = "1.1";
      }
      yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_VERSION,'\0',pcVar4,module,module->ext,
                         (uint)module->ext_size);
    }
    ly_print(out,"%*sbelongs-to %s {\n",(ulong)(uint)(iVar1 * 2),"");
    node._0_4_ = -1;
    while (node._0_4_ = lys_ext_iter(module->ext,module->ext_size,(char)(int)node + '\x01',
                                     LYEXT_SUBSTMT_BELONGSTO), (int)node != -1) {
      yang_print_extension_instances
                (out,level + 2,module,LYEXT_SUBSTMT_BELONGSTO,'\0',module->ext + (int)node,1);
    }
    yang_print_substmt(out,level + 2,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                       (uint)module->ext_size);
    ly_print(out,"%*s}\n",(ulong)(uint)(iVar1 * 2),"");
  }
  module_local._4_4_ = level + 1;
  for (node._4_4_ = 0; node._4_4_ < module->imp_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n%*simport %s {\n",(ulong)(uint)(module_local._4_4_ * 2),"");
    iVar1 = level + 2;
    yang_print_extension_instances
              (out,iVar1,module,LYEXT_SUBSTMT_SELF,'\0',module->imp[node._4_4_].ext,
               (uint)module->imp[node._4_4_].ext_size);
    yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_PREFIX,'\0',module->imp[node._4_4_].prefix,module,
                       module->imp[node._4_4_].ext,(uint)module->imp[node._4_4_].ext_size);
    if (module->imp[node._4_4_].rev[0] != '\0') {
      yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_REVISIONDATE,'\0',module->imp[node._4_4_].rev,
                         module,module->imp[node._4_4_].ext,(uint)module->imp[node._4_4_].ext_size);
    }
    yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_DESCRIPTION,'\0',module->imp[node._4_4_].dsc,module,
                       module->imp[node._4_4_].ext,(uint)module->imp[node._4_4_].ext_size);
    yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_REFERENCE,'\0',module->imp[node._4_4_].ref,module,
                       module->imp[node._4_4_].ext,(uint)module->imp[node._4_4_].ext_size);
    ly_print(out,"%*s}\n",(ulong)(uint)(module_local._4_4_ * 2),"");
  }
  for (node._4_4_ = 0; node._4_4_ < module->inc_size; node._4_4_ = node._4_4_ + 1) {
    if ((((module->inc[node._4_4_].rev[0] == '\0') && (module->inc[node._4_4_].dsc == (char *)0x0))
        && (module->inc[node._4_4_].ref == (char *)0x0)) &&
       (module->inc[node._4_4_].ext_size == '\0')) {
      ly_print(out,"\n%*sinclude \"%s\";\n",(ulong)(uint)(module_local._4_4_ * 2),"",
               (module->inc[node._4_4_].submodule)->name);
    }
    else {
      ly_print(out,"\n%*sinclude %s {\n",(ulong)(uint)(module_local._4_4_ * 2),"");
      iVar1 = level + 2;
      yang_print_extension_instances
                (out,iVar1,module,LYEXT_SUBSTMT_SELF,'\0',module->inc[node._4_4_].ext,
                 (uint)module->inc[node._4_4_].ext_size);
      if (module->inc[node._4_4_].rev[0] != '\0') {
        yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_REVISIONDATE,'\0',module->inc[node._4_4_].rev,
                           module,module->inc[node._4_4_].ext,(uint)module->inc[node._4_4_].ext_size
                          );
      }
      yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_DESCRIPTION,'\0',module->inc[node._4_4_].dsc,module
                         ,module->inc[node._4_4_].ext,(uint)module->inc[node._4_4_].ext_size);
      yang_print_substmt(out,iVar1,LYEXT_SUBSTMT_REFERENCE,'\0',module->inc[node._4_4_].ref,module,
                         module->inc[node._4_4_].ext,(uint)module->inc[node._4_4_].ext_size);
      ly_print(out,"%*s}\n",(ulong)(uint)(module_local._4_4_ * 2),"");
    }
  }
  if (((module->org != (char *)0x0) || (module->contact != (char *)0x0)) ||
     ((module->dsc != (char *)0x0 || (module->ref != (char *)0x0)))) {
    ly_print(out,"\n");
  }
  yang_print_substmt(out,module_local._4_4_,LYEXT_SUBSTMT_ORGANIZATION,'\0',module->org,module,
                     module->ext,(uint)module->ext_size);
  yang_print_substmt(out,module_local._4_4_,LYEXT_SUBSTMT_CONTACT,'\0',module->contact,module,
                     module->ext,(uint)module->ext_size);
  yang_print_substmt(out,module_local._4_4_,LYEXT_SUBSTMT_DESCRIPTION,'\0',module->dsc,module,
                     module->ext,(uint)module->ext_size);
  yang_print_substmt(out,module_local._4_4_,LYEXT_SUBSTMT_REFERENCE,'\0',module->ref,module,
                     module->ext,(uint)module->ext_size);
  if (module->rev_size != '\0') {
    ly_print(out,"\n");
  }
  for (node._4_4_ = 0; node._4_4_ < module->rev_size; node._4_4_ = node._4_4_ + 1) {
    yang_print_revision(out,module_local._4_4_,module,module->rev + node._4_4_);
  }
  for (node._4_4_ = 0; node._4_4_ < module->extensions_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n");
    yang_print_extension(out,module_local._4_4_,module->extensions + node._4_4_);
  }
  if (module->ext_size != '\0') {
    ly_print(out,"\n");
    yang_print_extension_instances
              (out,module_local._4_4_,module,LYEXT_SUBSTMT_SELF,'\0',module->ext,
               (uint)module->ext_size);
  }
  for (node._4_4_ = 0; node._4_4_ < module->features_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n");
    yang_print_feature(out,module_local._4_4_,module->features + node._4_4_);
  }
  for (node._4_4_ = 0; node._4_4_ < module->ident_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n");
    yang_print_identity(out,module_local._4_4_,module->ident + node._4_4_);
  }
  for (node._4_4_ = 0; node._4_4_ < module->tpdf_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n");
    yang_print_typedef(out,module_local._4_4_,module,module->tpdf + node._4_4_);
  }
  plVar3 = lys_main_module(module);
  for (local_30 = plVar3->data; local_30 != (lys_node *)0x0; local_30 = local_30->next) {
    if (local_30->module == module) {
      yang_print_snode(out,module_local._4_4_,local_30,0x800);
    }
  }
  plVar3 = lys_main_module(module);
  for (local_30 = plVar3->data; local_30 != (lys_node *)0x0; local_30 = local_30->next) {
    if (local_30->module == module) {
      yang_print_snode(out,module_local._4_4_,local_30,0x903f);
    }
  }
  for (node._4_4_ = 0; node._4_4_ < module->augment_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n");
    yang_print_augment(out,module_local._4_4_,module->augment + node._4_4_);
  }
  plVar3 = lys_main_module(module);
  for (local_30 = plVar3->data; local_30 != (lys_node *)0x0; local_30 = local_30->next) {
    if (local_30->module == module) {
      yang_print_snode(out,module_local._4_4_,local_30,0x4100);
    }
  }
  plVar3 = lys_main_module(module);
  for (local_30 = plVar3->data; local_30 != (lys_node *)0x0; local_30 = local_30->next) {
    if (local_30->module == module) {
      yang_print_snode(out,module_local._4_4_,local_30,0x80);
    }
  }
  for (node._4_4_ = 0; node._4_4_ < module->deviation_size; node._4_4_ = node._4_4_ + 1) {
    ly_print(out,"\n");
    yang_print_deviation(out,module_local._4_4_,module,module->deviation + node._4_4_);
  }
  ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
  ly_print_flush(out);
  return 0;
}

Assistant:

static int
yang_print_model_(struct lyout *out, int level, const struct lys_module *module)
{
    unsigned int i;
    int p;

    struct lys_node *node;

    /* (sub)module-header-stmts */
    if (module->type) {
        ly_print(out, "%*ssubmodule %s {%s\n", LEVEL, INDENT, module->name,
                 (module->deviated == 1 ? " // DEVIATED" : ""));
        level++;
        if (lys_main_module(module)->version > 1 ||
                lys_ext_iter(module->ext, module->ext_size, 0, LYEXT_SUBSTMT_VERSION) != -1) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0,
                               ((struct lys_submodule *)module)->belongsto->version == 2 ? "1.1" : "1",
                               module, module->ext, module->ext_size);
        }
        ly_print(out, "%*sbelongs-to %s {\n", LEVEL, INDENT, ((struct lys_submodule *)module)->belongsto->name);
        p = -1;
        while ((p = lys_ext_iter(module->ext, module->ext_size, p + 1, LYEXT_SUBSTMT_BELONGSTO)) != -1) {
            yang_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_BELONGSTO, 0, &module->ext[p], 1);
        }
        yang_print_substmt(out, level + 1, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*smodule %s {%s\n", LEVEL, INDENT, module->name,
                 (module->deviated == 1 ? " // DEVIATED" : ""));
        level++;
        if (module->version) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0, module->version == 2 ? "1.1" : "1",
                               module, module->ext, module->ext_size);
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_NAMESPACE, 0, module->ns,
                           module, module->ext, module->ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
    }

    /* linkage-stmts */
    for (i = 0; i < module->imp_size; i++) {
        ly_print(out, "\n%*simport %s {\n", LEVEL, INDENT, module->imp[i].module->name);
        level++;
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                       module->imp[i].ext, module->imp[i].ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->imp[i].prefix,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        if (module->imp[i].rev[0]) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->imp[i].rev,
                               module, module->imp[i].ext, module->imp[i].ext_size);
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->imp[i].dsc,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->imp[i].ref,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        level--;
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    }
    for (i = 0; i < module->inc_size; i++) {
        if (module->inc[i].rev[0] || module->inc[i].dsc || module->inc[i].ref || module->inc[i].ext_size) {
            ly_print(out, "\n%*sinclude %s {\n", LEVEL, INDENT, module->inc[i].submodule->name);
            level++;
            yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                           module->inc[i].ext, module->inc[i].ext_size);
            if (module->inc[i].rev[0]) {
                yang_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->inc[i].rev,
                                   module, module->inc[i].ext, module->inc[i].ext_size);
            }
            yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->inc[i].dsc,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->inc[i].ref,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            level--;
            ly_print(out, "%*s}\n", LEVEL, INDENT);
        } else {
            ly_print(out, "\n%*sinclude \"%s\";\n", LEVEL, INDENT, module->inc[i].submodule->name);
        }
    }

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        ly_print(out, "\n");
    }
    yang_print_substmt(out, level, LYEXT_SUBSTMT_ORGANIZATION, 0, module->org,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_CONTACT, 0, module->contact,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->dsc,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->ref,
                       module, module->ext, module->ext_size);

    /* revision-stmts */
    if (module->rev_size) {
        ly_print(out, "\n");
    }
    for (i = 0; i < module->rev_size; i++) {
        yang_print_revision(out, level, module, &module->rev[i]);
    }

    /* body-stmts */
    for (i = 0; i < module->extensions_size; i++) {
        ly_print(out, "\n");
        yang_print_extension(out, level, &module->extensions[i]);
    }
    if (module->ext_size) {
        ly_print(out, "\n");
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, module->ext, module->ext_size);
    }

    for (i = 0; i < module->features_size; i++) {
        ly_print(out, "\n");
        yang_print_feature(out, level, &module->features[i]);
    }

    for (i = 0; i < module->ident_size; i++) {
        ly_print(out, "\n");
        yang_print_identity(out, level, &module->ident[i]);
    }

    for (i = 0; i < module->tpdf_size; i++) {
        ly_print(out, "\n");
        yang_print_typedef(out, level, module, &module->tpdf[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_GROUPING);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                             LYS_USES | LYS_ANYDATA);
    }

    for (i = 0; i < module->augment_size; i++) {
        ly_print(out, "\n");
        yang_print_augment(out, level, &module->augment[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_RPC | LYS_ACTION);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_NOTIF);
    }

    for (i = 0; i < module->deviation_size; ++i) {
        ly_print(out, "\n");
        yang_print_deviation(out, level, module, &module->deviation[i]);
    }

    level--;
    ly_print(out, "%*s}\n", LEVEL, INDENT);
    ly_print_flush(out);

    return EXIT_SUCCESS;
}